

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  undefined4 local_34;
  int iFanin;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  iVar1 = Wlc_ObjCopy(p,iObj);
  if (iVar1 == 0) {
    p_00 = Wlc_NtkObj(p,iObj);
    for (local_34 = 0; iVar1 = Wlc_ObjFaninNum(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Wlc_ObjFaninId(p_00,local_34);
      Wlc_NtkDupDfs_rec(pNew,p,iVar1,vFanins);
    }
    Wlc_ObjDup(pNew,p,iObj,vFanins);
  }
  return;
}

Assistant:

void Wlc_NtkDupDfs_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
    Wlc_ObjDup( pNew, p, iObj, vFanins );
}